

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

MTBDD mtbdd_set_add(MTBDD set,uint32_t var)

{
  MTBDD MVar1;
  long lVar2;
  ulong set_00;
  uint uVar3;
  
  lVar2 = (set & 0xffffffffff) * 0x10;
  uVar3 = (uint)((ulong)*(undefined8 *)(nodes->data + lVar2 + 8) >> 0x28);
  if (var < uVar3) {
    if (set != 0) {
LAB_00128844:
      MVar1 = _mtbdd_makenode(var,0,set);
      return MVar1;
    }
  }
  else {
    if (uVar3 == var) {
      return set;
    }
    set_00 = set & 0x8000000000000000 ^ *(ulong *)(nodes->data + lVar2) & 0x800000ffffffffff;
    MVar1 = mtbdd_set_add(set_00,var);
    if (set_00 == MVar1) {
      return set;
    }
    set = MVar1;
    var = uVar3;
    if (MVar1 != 0) goto LAB_00128844;
  }
  return 0;
}

Assistant:

MTBDD
mtbdd_set_add(MTBDD set, uint32_t var)
{
    if (set == mtbdd_true) return mtbdd_makenode(var, mtbdd_false, mtbdd_true);

    mtbddnode_t set_node = MTBDD_GETNODE(set);
    uint32_t set_var = mtbddnode_getvariable(set_node);
    if (var < set_var) return mtbdd_makenode(var, mtbdd_false, set);
    else if (set_var == var) return set;
    else {
        MTBDD sub = mtbddnode_followhigh(set, set_node);
        MTBDD res = mtbdd_set_add(sub, var);
        res = sub == res ? set : mtbdd_makenode(set_var, mtbdd_false, res);
        return res;
    }
}